

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

void __thiscall IRT::TreePattern::~TreePattern(TreePattern *this)

{
  TreePattern *this_local;
  
  this->_vptr_TreePattern = (_func_int **)&PTR__TreePattern_00238c50;
  std::__cxx11::string::~string((string *)&this->stringRepresentation);
  std::shared_ptr<IRT::INode>::~shared_ptr(&this->treeRepresentation);
  return;
}

Assistant:

IRT::TreePattern::~TreePattern( ) {
}